

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

int __thiscall Mat::countNe(Mat *this,ll128 *b)

{
  ll128 *plVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ll128 *plVar5;
  uint in_ECX;
  long extraout_RDX;
  uint uVar6;
  int iVar7;
  int iVar8;
  int j;
  int a;
  
  uVar4 = this->r;
  iVar7 = this->c;
  plVar1 = *(ll128 **)b;
  lVar2 = *(long *)((long)b + 8);
  uVar6 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  iVar8 = 0;
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    for (a = 0; iVar7 != a; a = a + 1) {
      plVar5 = get((ll128 *)this,(Mat *)(ulong)uVar6,a,in_ECX);
      bVar3 = plVar5 != plVar1 || extraout_RDX != lVar2;
      in_ECX = (uint)bVar3;
      iVar8 = iVar8 + (uint)bVar3;
    }
  }
  return iVar8;
}

Assistant:

int Mat::countNe(const ll128 &b) const {
    int ret = 0;
    for (int i = 0; i < r; i++)
        for (int j = 0; j < c; j++)
            if (get(i, j) != b)
                ret++;
    return ret;
}